

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

CentralDirectoryEntry *
find_file_in_zip(BYTE *dir,char *path,uint len,uint crc,short date,short time)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  
  sVar3 = strlen(path);
  if (*(int *)dir == 0x2014b50) {
    do {
      uVar1 = ((CentralDirectoryEntry *)dir)->NameLength;
      if (((uint)sVar3 == (uint)uVar1) &&
         (iVar2 = strncmp((char *)((long)dir + 0x2e),path,sVar3 & 0xffffffff), iVar2 == 0)) {
        if (((CentralDirectoryEntry *)dir)->CRC32 != crc) {
          return (CentralDirectoryEntry *)0x0;
        }
        if (((CentralDirectoryEntry *)dir)->UncompressedSize != len) {
          return (CentralDirectoryEntry *)0x0;
        }
        if ((((CentralDirectoryEntry *)dir)->Flags & 1) != 0) {
          return (CentralDirectoryEntry *)0x0;
        }
        if (((CentralDirectoryEntry *)dir)->ExtraLength != 0) {
          return (CentralDirectoryEntry *)0x0;
        }
        return (CentralDirectoryEntry *)dir;
      }
      dir = ((CentralDirectoryEntry *)((long)dir + 0x2e))->VersionMadeBy +
            (ulong)((CentralDirectoryEntry *)dir)->CommentLength +
            (ulong)((CentralDirectoryEntry *)dir)->ExtraLength + (ulong)uVar1 + -4;
    } while (((CentralDirectoryEntry *)dir)->Magic == 0x2014b50);
  }
  return (CentralDirectoryEntry *)0x0;
}

Assistant:

CentralDirectoryEntry *find_file_in_zip(BYTE *dir, const char *path, unsigned int len, unsigned int crc, short date, short time)
{
	int pathlen = (int)strlen(path);
	CentralDirectoryEntry *ent;
	int flags;

	while (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) == 0)
	{
		ent = (CentralDirectoryEntry *)dir;
		if (pathlen == LittleShort(ent->NameLength) &&
			strncmp((char *)(ent + 1), path, pathlen) == 0)
		{
			// Found something that matches by name.
			break;
		}
		dir += sizeof(*ent) + LittleShort(ent->NameLength) + LittleShort(ent->ExtraLength) + LittleShort(ent->CommentLength);
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		return NULL;
	}
	if (crc != LittleLong(ent->CRC32))
	{
		return NULL;
	}
	if (len != LittleLong(ent->UncompressedSize))
	{
		return NULL;
	}
	// Should I check modification date and time here?
	flags = LittleShort(ent->Flags);
	if (flags & 1)
	{ // Don't want to deal with encryption.
		return NULL;
	}
	if (ent->ExtraLength != 0)
	{ // Don't want to deal with extra data.
		return NULL;
	}
	// Okay, looks good.
	return ent;
}